

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_details::load(xr_scene_details *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  xr_reader *pxVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  xr_scene_revision *this_00;
  size_t sVar5;
  ulong uVar6;
  detail_slot_v3 *pdVar7;
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *pxStack_18;
  uint32_t version;
  xr_reader *r_local;
  xr_scene_details *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  this_00 = xr_scene_part::revision(&this->super_xr_scene_part);
  xr_scene_revision::load(this_00,pxStack_18);
  sVar5 = xr_reader::r_chunk<unsigned_int>(pxStack_18,0x1000,(uint *)((long)&s + 4));
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x42,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  if (s._4_4_ != 3) {
    __assert_fail("version == DETMGR_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x43,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  xr_reader::r_chunk<unsigned_int>(pxStack_18,0x1006,&this->m_flags);
  sVar5 = xr_reader::find_chunk(pxStack_18,0);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x47,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  details_header::load(&this->m_header,pxStack_18);
  xr_reader::debug_find_chunk(pxStack_18);
  sVar5 = xr_reader::find_chunk(pxStack_18,2);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x4c,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  uVar4 = xr_reader::r_u32(pxStack_18);
  this->m_num_slots = uVar4;
  if (uVar4 != 0) {
    if (this->m_num_slots != (this->m_header).size_x * (this->m_header).size_z) {
      __assert_fail("m_num_slots == m_header.size_x*m_header.size_z",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                    ,0x4e,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
    }
    auVar1 = ZEXT416(this->m_num_slots) * ZEXT816(0x10);
    uVar6 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pdVar7 = (detail_slot_v3 *)operator_new__(uVar6);
    this->m_slots = pdVar7;
    xr_reader::r_cseq<xray_re::detail_slot_v3>(pxStack_18,(ulong)this->m_num_slots,this->m_slots);
  }
  xr_reader::debug_find_chunk(pxStack_18);
  local_28 = xr_reader::open_chunk(pxStack_18,1);
  if (local_28 != (xr_reader *)0x0) {
    xr_reader::
    r_chunks<std::vector<xray_re::detail_object*,std::allocator<xray_re::detail_object*>>,read_detail>
              (local_28,&this->m_objects);
    xr_reader::close_chunk(pxStack_18,&local_28);
  }
  sVar5 = xr_reader::find_chunk(pxStack_18,0x1003);
  pxVar2 = pxStack_18;
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x5b,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  uVar3 = xr_reader::r_u8(pxStack_18);
  xr_reader::
  r_seq<std::vector<xray_re::color_index*,std::allocator<xray_re::color_index*>>,read_color_index>
            (pxVar2,uVar3,&this->m_indices);
  xr_reader::debug_find_chunk(pxStack_18);
  sVar5 = xr_reader::r_chunk<xray_re::_aabb<float>>(pxStack_18,0x1001,&this->m_bbox);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x60,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  sVar5 = xr_reader::find_chunk(pxStack_18,0x1004);
  pxVar2 = pxStack_18;
  if (sVar5 != 0) {
    uVar4 = xr_reader::r_u32(pxStack_18);
    xr_reader::
    r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
              (pxVar2,uVar4,&this->m_snap_objects);
  }
  xr_reader::r_chunk<float>(pxStack_18,0x1005,&this->m_density);
  sVar5 = xr_reader::find_chunk(pxStack_18,0x1002);
  if (sVar5 != 0) {
    xr_reader::r_sz(pxStack_18,&this->m_texture);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  return;
}

Assistant:

void xr_scene_details::load(xr_reader& r)
{
	revision().load(r);

	uint32_t version;
	if (!r.r_chunk<uint32_t>(DETMGR_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == DETMGR_VERSION);

	r.r_chunk<uint32_t>(DETMGR_CHUNK_FLAGS, m_flags);
	if (!r.find_chunk(DETMGR_CHUNK_HEADER))
		xr_not_expected();
	m_header.load(r);
	r.debug_find_chunk();

	if (!r.find_chunk(DETMGR_CHUNK_SLOTS))
		xr_not_expected();
	if ((m_num_slots = r.r_u32())) {
		xr_assert(m_num_slots == m_header.size_x*m_header.size_z);
		m_slots = new detail_slot_v3[m_num_slots];
		r.r_cseq(m_num_slots, m_slots);
	}
	r.debug_find_chunk();

	xr_reader* s = r.open_chunk(DETMGR_CHUNK_OBJECTS);
	if (s) {
		s->r_chunks(m_objects, read_detail());
		r.close_chunk(s);
	}

	if (!r.find_chunk(DETMGR_CHUNK_COLOR_INDEX))
		xr_not_expected();
	r.r_seq(r.r_u8(), m_indices, read_color_index());
	r.debug_find_chunk();

	if (!r.r_chunk(DETMGR_CHUNK_BBOX, m_bbox))
		xr_not_expected();

	if (r.find_chunk(DETMGR_CHUNK_SNAP_OBJECTS))
		r.r_seq(r.r_u32(), m_snap_objects, xr_reader::f_r_sz());

	r.r_chunk(DETMGR_CHUNK_DENSITY, m_density);

	if (r.find_chunk(DETMGR_CHUNK_TEXTURE)) {
		r.r_sz(m_texture);
		r.debug_find_chunk();
	}
}